

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::GenKeyGetter_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,FieldDef *key_field)

{
  char *pcVar1;
  FieldDef *pFVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [8];
  string field_getter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40;
  char *data_buffer;
  allocator<char> local_22;
  undefined1 local_21;
  FieldDef *local_20;
  FieldDef *key_field_local;
  JavaGenerator *this_local;
  string *key_getter;
  
  local_21 = 0;
  local_20 = key_field;
  key_field_local = (FieldDef *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator(&local_22);
  local_40 = "_bb";
  bVar3 = IsString(&(local_20->value).type);
  pFVar2 = local_20;
  pcVar1 = local_40;
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," return ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"compareStrings(");
    GenOffsetGetter_abi_cxx11_(&local_80,this,local_20,"o1");
    std::operator+(&local_60,&local_80,", ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    GenOffsetGetter_abi_cxx11_((string *)((long)&field_getter.field_2 + 8),this,local_20,"o2");
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_getter.field_2 + 8),", ");
    std::operator+(&local_c0,&local_e0,local_40);
    std::operator+(&local_a0,&local_c0,")");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)(field_getter.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,pcVar1,&local_141);
    GenGetterForLookupByKey((string *)local_120,this,pFVar2,&local_140,"o1");
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    GenTypeNameDest_abi_cxx11_(&local_1a8,this,&(local_20->value).type);
    std::operator+(&local_188,"\n    ",&local_1a8);
    std::operator+(&local_168,&local_188," val_1 = ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::operator+(&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   ";\n    ");
    GenTypeNameDest_abi_cxx11_(&local_208,this,&(local_20->value).type);
    std::operator+(&local_1c8,&local_1e8,&local_208);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," val_2 = ");
    pFVar2 = local_20;
    pcVar1 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar1,&local_249);
    GenGetterForLookupByKey(&local_228,this,pFVar2,&local_248,"o2");
    std::__cxx11::string::operator=((string *)local_120,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::operator+(&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   ";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "    return val_1 > val_2 ? 1 : val_1 < val_2 ? -1 : 0;\n ");
    std::__cxx11::string::~string((string *)local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenKeyGetter(flatbuffers::FieldDef *key_field) const {
    std::string key_getter = "";
    auto data_buffer = "_bb";
    if (IsString(key_field->value.type)) {
      key_getter += " return ";
      key_getter += "";
      key_getter += "compareStrings(";
      key_getter += GenOffsetGetter(key_field, "o1") + ", ";
      key_getter += GenOffsetGetter(key_field, "o2") + ", " + data_buffer + ")";
      key_getter += ";";
    } else {
      auto field_getter = GenGetterForLookupByKey(key_field, data_buffer, "o1");
      key_getter +=
          "\n    " + GenTypeNameDest(key_field->value.type) + " val_1 = ";
      key_getter +=
          field_getter + ";\n    " + GenTypeNameDest(key_field->value.type);
      key_getter += " val_2 = ";
      field_getter = GenGetterForLookupByKey(key_field, data_buffer, "o2");
      key_getter += field_getter + ";\n";
      key_getter += "    return val_1 > val_2 ? 1 : val_1 < val_2 ? -1 : 0;\n ";
    }
    return key_getter;
  }